

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution.hpp
# Opt level: O0

ostream * operator<<(ostream *out,SpecificSolution *spec)

{
  int iVar1;
  runtime_error *this;
  int *in_RSI;
  ostream *in_RDI;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    std::operator<<(in_RDI,"no roots");
  }
  else if (iVar1 == 1) {
    std::operator<<(in_RDI,"any number");
  }
  else {
    if (iVar1 != 2) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unexpected SpecificSolution found");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<(in_RDI,"cannot solve");
  }
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const SpecificSolution &spec) {
    switch (spec) {
        case SpecificSolution::kNoRoots:
            out << "no roots";
            break;
        case SpecificSolution::kAnyNumberIsRoot:
            out << "any number";
            break;
        case SpecificSolution::kCannotSolve:
            out << "cannot solve";
            break;
        default:
            throw std::runtime_error("Unexpected SpecificSolution found");
    }
    return out;
}